

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

ostream * operator<<(ostream *out,Image *image)

{
  Image local_38;
  Image *local_18;
  Image *image_local;
  ostream *out_local;
  
  local_18 = image;
  image_local = (Image *)out;
  Image::toString_abi_cxx11_(&local_38);
  std::operator<<(out,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (ostream *)image_local;
}

Assistant:

std::ostream &operator<<(std::ostream &out, Image& image)
{
    out << image.toString();

    return out;
}